

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

uint64_t __thiscall
FIX::double_conversion::ReadUint64
          (double_conversion *this,Vector<const_char> buffer,int *number_of_read_digits)

{
  double_conversion *pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((int)(uint)buffer.start_ < 1) {
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      pdVar1 = this + uVar3;
      if (9 < (byte)((char)*pdVar1 - 0x30U)) {
        __assert_fail("0 <= digit && digit <= 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xa4,"uint64_t FIX::double_conversion::ReadUint64(Vector<const char>, int *)"
                     );
      }
      uVar3 = uVar3 + 1;
      uVar2 = (ulong)((byte)*pdVar1 & 0xf) + uVar2 * 10;
    } while ((uVar3 < (uint)buffer.start_) && (uVar2 < 0x1999999999999999));
  }
  *buffer._8_8_ = (int)uVar3;
  return uVar2;
}

Assistant:

static uint64_t ReadUint64(Vector<const char> buffer,
                           int* number_of_read_digits) {
  uint64_t result = 0;
  int i = 0;
  while (i < buffer.length() && result <= (kMaxUint64 / 10 - 1)) {
    int digit = buffer[i++] - '0';
    ASSERT(0 <= digit && digit <= 9);
    result = 10 * result + digit;
  }
  *number_of_read_digits = i;
  return result;
}